

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_describe_scaling_rules.cc
# Opt level: O2

int __thiscall
aliyun::Ess::DescribeScalingRules
          (Ess *this,EssDescribeScalingRulesRequestType *req,
          EssDescribeScalingRulesResponseType *response,EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  Int IVar3;
  ArrayIndex AVar4;
  AliRpcRequest *this_00;
  Value *pVVar5;
  Value *pVVar6;
  Value *pVVar7;
  char *pcVar8;
  uint index;
  allocator<char> local_cdc;
  allocator<char> local_cdb;
  allocator<char> local_cda;
  allocator<char> local_cd9;
  Value val;
  undefined1 local_cb8 [32];
  _Alloc_hider local_c98;
  size_type local_c90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c88;
  _Alloc_hider local_c78;
  size_type local_c70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c68;
  Int local_c58;
  _Alloc_hider local_c50;
  size_type local_c48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c40;
  Int local_c30;
  Int local_c2c;
  Int local_c28;
  _Alloc_hider local_c20;
  size_type local_c18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c10;
  string str_response;
  string local_be0;
  string local_bc0;
  string local_ba0;
  string local_b80;
  string local_b60;
  string local_b40;
  string local_b20;
  string local_b00;
  string local_ae0;
  string local_ac0;
  string local_aa0;
  string local_a80;
  string local_a60;
  string local_a40;
  string local_a20;
  string local_a00;
  string local_9e0;
  string local_9c0;
  string local_9a0;
  string local_980;
  string local_960;
  string local_940;
  string local_920;
  string local_900;
  string local_8e0;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string secheme;
  string local_160;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar8 = "http";
  if (this->use_tls_ != false) {
    pcVar8 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar8,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->version_,(allocator<char> *)local_cb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c0,this->appid_,(allocator<char> *)&local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1e0,this->secret_,(allocator<char> *)&val);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_200,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_1a0,&local_1c0,&local_1e0,&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  if (((this->use_tls_ == false) && (pcVar8 = this->proxy_host_, pcVar8 != (char *)0x0)) &&
     (*pcVar8 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_220,pcVar8,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_220);
    std::__cxx11::string::~string((string *)&local_220);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"Action",(allocator<char> *)local_cb8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"DescribeScalingRules",(allocator<char> *)&local_160);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_240,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::__cxx11::string::~string((string *)&local_240);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"OwnerId",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_2a0,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_280,&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_280);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2c0,"ResourceOwnerAccount",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_2e0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2c0,&local_2e0);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_2c0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"ResourceOwnerId",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_320,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_300,&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((req->page_number)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_340,"PageNumber",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_360,(string *)&req->page_number);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_340,&local_360);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_340);
  }
  if ((req->page_size)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"PageSize",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_3a0,(string *)&req->page_size);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_380,&local_3a0);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_380);
  }
  if ((req->scaling_group_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"ScalingGroupId",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_3e0,(string *)&req->scaling_group_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3c0,&local_3e0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_3c0);
  }
  if ((req->scaling_rule_id1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"ScalingRuleId.1",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_420,(string *)&req->scaling_rule_id1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_400,&local_420);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_400);
  }
  if ((req->scaling_rule_id2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_440,"ScalingRuleId.2",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_460,(string *)&req->scaling_rule_id2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_440,&local_460);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
  }
  if ((req->scaling_rule_id3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_480,"ScalingRuleId.3",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_4a0,(string *)&req->scaling_rule_id3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_480,&local_4a0);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::__cxx11::string::~string((string *)&local_480);
  }
  if ((req->scaling_rule_id4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c0,"ScalingRuleId.4",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_4e0,(string *)&req->scaling_rule_id4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4c0,&local_4e0);
    std::__cxx11::string::~string((string *)&local_4e0);
    std::__cxx11::string::~string((string *)&local_4c0);
  }
  if ((req->scaling_rule_id5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_500,"ScalingRuleId.5",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_520,(string *)&req->scaling_rule_id5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_500,&local_520);
    std::__cxx11::string::~string((string *)&local_520);
    std::__cxx11::string::~string((string *)&local_500);
  }
  if ((req->scaling_rule_id6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_540,"ScalingRuleId.6",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_560,(string *)&req->scaling_rule_id6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_540,&local_560);
    std::__cxx11::string::~string((string *)&local_560);
    std::__cxx11::string::~string((string *)&local_540);
  }
  if ((req->scaling_rule_id7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_580,"ScalingRuleId.7",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_5a0,(string *)&req->scaling_rule_id7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_580,&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_580);
  }
  if ((req->scaling_rule_id8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5c0,"ScalingRuleId.8",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_5e0,(string *)&req->scaling_rule_id8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5c0,&local_5e0);
    std::__cxx11::string::~string((string *)&local_5e0);
    std::__cxx11::string::~string((string *)&local_5c0);
  }
  if ((req->scaling_rule_id9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_600,"ScalingRuleId.9",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_620,(string *)&req->scaling_rule_id9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_600,&local_620);
    std::__cxx11::string::~string((string *)&local_620);
    std::__cxx11::string::~string((string *)&local_600);
  }
  if ((req->scaling_rule_id10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_640,"ScalingRuleId.10",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_660,(string *)&req->scaling_rule_id10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_640,&local_660);
    std::__cxx11::string::~string((string *)&local_660);
    std::__cxx11::string::~string((string *)&local_640);
  }
  if ((req->scaling_rule_name1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_680,"ScalingRuleName.1",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_6a0,(string *)&req->scaling_rule_name1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_680,&local_6a0);
    std::__cxx11::string::~string((string *)&local_6a0);
    std::__cxx11::string::~string((string *)&local_680);
  }
  if ((req->scaling_rule_name2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c0,"ScalingRuleName.2",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_6e0,(string *)&req->scaling_rule_name2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6c0,&local_6e0);
    std::__cxx11::string::~string((string *)&local_6e0);
    std::__cxx11::string::~string((string *)&local_6c0);
  }
  if ((req->scaling_rule_name3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_700,"ScalingRuleName.3",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_720,(string *)&req->scaling_rule_name3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_700,&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    std::__cxx11::string::~string((string *)&local_700);
  }
  if ((req->scaling_rule_name4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_740,"ScalingRuleName.4",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_760,(string *)&req->scaling_rule_name4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_740,&local_760);
    std::__cxx11::string::~string((string *)&local_760);
    std::__cxx11::string::~string((string *)&local_740);
  }
  if ((req->scaling_rule_name5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_780,"ScalingRuleName.5",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_7a0,(string *)&req->scaling_rule_name5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_780,&local_7a0);
    std::__cxx11::string::~string((string *)&local_7a0);
    std::__cxx11::string::~string((string *)&local_780);
  }
  if ((req->scaling_rule_name6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7c0,"ScalingRuleName.6",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_7e0,(string *)&req->scaling_rule_name6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7c0,&local_7e0);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::__cxx11::string::~string((string *)&local_7c0);
  }
  if ((req->scaling_rule_name7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_800,"ScalingRuleName.7",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_820,(string *)&req->scaling_rule_name7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_800,&local_820);
    std::__cxx11::string::~string((string *)&local_820);
    std::__cxx11::string::~string((string *)&local_800);
  }
  if ((req->scaling_rule_name8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_840,"ScalingRuleName.8",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_860,(string *)&req->scaling_rule_name8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_840,&local_860);
    std::__cxx11::string::~string((string *)&local_860);
    std::__cxx11::string::~string((string *)&local_840);
  }
  if ((req->scaling_rule_name9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_880,"ScalingRuleName.9",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_8a0,(string *)&req->scaling_rule_name9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_880,&local_8a0);
    std::__cxx11::string::~string((string *)&local_8a0);
    std::__cxx11::string::~string((string *)&local_880);
  }
  if ((req->scaling_rule_name10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,"ScalingRuleName.10",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_8e0,(string *)&req->scaling_rule_name10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8c0,&local_8e0);
    std::__cxx11::string::~string((string *)&local_8e0);
    std::__cxx11::string::~string((string *)&local_8c0);
  }
  if ((req->scaling_rule_ari1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_900,"ScalingRuleAri.1",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_920,(string *)&req->scaling_rule_ari1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_900,&local_920);
    std::__cxx11::string::~string((string *)&local_920);
    std::__cxx11::string::~string((string *)&local_900);
  }
  if ((req->scaling_rule_ari2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_940,"ScalingRuleAri.2",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_960,(string *)&req->scaling_rule_ari2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_940,&local_960);
    std::__cxx11::string::~string((string *)&local_960);
    std::__cxx11::string::~string((string *)&local_940);
  }
  if ((req->scaling_rule_ari3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_980,"ScalingRuleAri.3",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_9a0,(string *)&req->scaling_rule_ari3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_980,&local_9a0);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::__cxx11::string::~string((string *)&local_980);
  }
  if ((req->scaling_rule_ari4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9c0,"ScalingRuleAri.4",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_9e0,(string *)&req->scaling_rule_ari4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_9c0,&local_9e0);
    std::__cxx11::string::~string((string *)&local_9e0);
    std::__cxx11::string::~string((string *)&local_9c0);
  }
  if ((req->scaling_rule_ari5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a00,"ScalingRuleAri.5",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_a20,(string *)&req->scaling_rule_ari5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a00,&local_a20);
    std::__cxx11::string::~string((string *)&local_a20);
    std::__cxx11::string::~string((string *)&local_a00);
  }
  if ((req->scaling_rule_ari6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a40,"ScalingRuleAri.6",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_a60,(string *)&req->scaling_rule_ari6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a40,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::__cxx11::string::~string((string *)&local_a40);
  }
  if ((req->scaling_rule_ari7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a80,"ScalingRuleAri.7",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_aa0,(string *)&req->scaling_rule_ari7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_a80,&local_aa0);
    std::__cxx11::string::~string((string *)&local_aa0);
    std::__cxx11::string::~string((string *)&local_a80);
  }
  if ((req->scaling_rule_ari8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac0,"ScalingRuleAri.8",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_ae0,(string *)&req->scaling_rule_ari8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_ac0,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::__cxx11::string::~string((string *)&local_ac0);
  }
  if ((req->scaling_rule_ari9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b00,"ScalingRuleAri.9",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_b20,(string *)&req->scaling_rule_ari9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b00,&local_b20);
    std::__cxx11::string::~string((string *)&local_b20);
    std::__cxx11::string::~string((string *)&local_b00);
  }
  if ((req->scaling_rule_ari10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b40,"ScalingRuleAri.10",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_b60,(string *)&req->scaling_rule_ari10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b40,&local_b60);
    std::__cxx11::string::~string((string *)&local_b60);
    std::__cxx11::string::~string((string *)&local_b40);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b80,"OwnerAccount",(allocator<char> *)local_cb8);
    std::__cxx11::string::string((string *)&local_ba0,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_b80,&local_ba0);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::__cxx11::string::~string((string *)&local_b80);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_bc0,"RegionId",(allocator<char> *)local_cb8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_be0,this->region_id_,(allocator<char> *)&local_160);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_bc0,&local_be0);
    std::__cxx11::string::~string((string *)&local_be0);
    std::__cxx11::string::~string((string *)&local_bc0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_((string *)local_cb8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_cb8,anon_var_dwarf_10f6e6 + 9,&local_cd9);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)local_cb8);
        std::__cxx11::string::~string((string *)local_cb8);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_((string *)local_cb8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_cb8,anon_var_dwarf_10f6e6 + 9,&local_cda);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)local_cb8);
        std::__cxx11::string::~string((string *)local_cb8);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_((string *)local_cb8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_cb8,anon_var_dwarf_10f6e6 + 9,&local_cdb);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)local_cb8);
        std::__cxx11::string::~string((string *)local_cb8);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_((string *)local_cb8,pVVar5);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_cb8,anon_var_dwarf_10f6e6 + 9,&local_cdc);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)local_cb8);
        std::__cxx11::string::~string((string *)local_cb8);
      }
      if (response != (EssDescribeScalingRulesResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"TotalCount");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"TotalCount");
          IVar3 = Json::Value::asInt(pVVar5);
          response->total_count = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageNumber");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageNumber");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_number = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"PageSize");
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"PageSize");
          IVar3 = Json::Value::asInt(pVVar5);
          response->page_size = IVar3;
        }
        bVar1 = Json::Value::isMember(&val,"ScalingRules");
        iVar2 = 200;
        if (bVar1) {
          pVVar5 = Json::Value::operator[](&val,"ScalingRules");
          bVar1 = Json::Value::isMember(pVVar5,"ScalingRule");
          if (bVar1) {
            pVVar5 = Json::Value::operator[](&val,"ScalingRules");
            pVVar5 = Json::Value::operator[](pVVar5,"ScalingRule");
            bVar1 = Json::Value::isArray(pVVar5);
            if (bVar1) {
              for (index = 0; AVar4 = Json::Value::size(pVVar5), index < AVar4; index = index + 1) {
                local_cb8._0_8_ = local_cb8 + 0x10;
                local_cb8._8_8_ = 0;
                local_cb8[0x10] = '\0';
                local_c98._M_p = (pointer)&local_c88;
                local_c90 = 0;
                local_c88._M_local_buf[0] = '\0';
                local_c78._M_p = (pointer)&local_c68;
                local_c70 = 0;
                local_c68._M_local_buf[0] = '\0';
                local_c50._M_p = (pointer)&local_c40;
                local_c48 = 0;
                local_c40._M_local_buf[0] = '\0';
                local_c20._M_p = (pointer)&local_c10;
                local_c18 = 0;
                local_c10._M_local_buf[0] = '\0';
                pVVar6 = Json::Value::operator[](pVVar5,index);
                bVar1 = Json::Value::isMember(pVVar6,"ScalingRuleId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScalingRuleId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)local_cb8,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ScalingGroupId");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScalingGroupId");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_c98,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ScalingRuleName");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"ScalingRuleName");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_c78,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"Cooldown");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"Cooldown");
                  local_c58 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"AdjustmentType");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"AdjustmentType");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar7);
                  std::__cxx11::string::operator=((string *)&local_c50,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                bVar1 = Json::Value::isMember(pVVar6,"AdjustmentValue");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"AdjustmentValue");
                  local_c30 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"MinSize");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"MinSize");
                  local_c2c = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"MaxSize");
                if (bVar1) {
                  pVVar7 = Json::Value::operator[](pVVar6,"MaxSize");
                  local_c28 = Json::Value::asInt(pVVar7);
                }
                bVar1 = Json::Value::isMember(pVVar6,"ScalingRuleAri");
                if (bVar1) {
                  pVVar6 = Json::Value::operator[](pVVar6,"ScalingRuleAri");
                  Json::Value::asString_abi_cxx11_(&local_160,pVVar6);
                  std::__cxx11::string::operator=((string *)&local_c20,(string *)&local_160);
                  std::__cxx11::string::~string((string *)&local_160);
                }
                std::
                vector<aliyun::EssDescribeScalingRulesScalingRuleType,_std::allocator<aliyun::EssDescribeScalingRulesScalingRuleType>_>
                ::push_back(&response->scaling_rules,(value_type *)local_cb8);
                EssDescribeScalingRulesScalingRuleType::~EssDescribeScalingRulesScalingRuleType
                          ((EssDescribeScalingRulesScalingRuleType *)local_cb8);
              }
            }
          }
        }
      }
      goto LAB_0013e9cf;
    }
  }
  iVar2 = -1;
  if (error_info != (EssErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0013e9cf:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ess::DescribeScalingRules(const EssDescribeScalingRulesRequestType& req,
                      EssDescribeScalingRulesResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","DescribeScalingRules");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.page_number.empty()) {
    req_rpc->AddRequestQuery("PageNumber", req.page_number);
  }
  if(!req.page_size.empty()) {
    req_rpc->AddRequestQuery("PageSize", req.page_size);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.scaling_rule_id1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.1", req.scaling_rule_id1);
  }
  if(!req.scaling_rule_id2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.2", req.scaling_rule_id2);
  }
  if(!req.scaling_rule_id3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.3", req.scaling_rule_id3);
  }
  if(!req.scaling_rule_id4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.4", req.scaling_rule_id4);
  }
  if(!req.scaling_rule_id5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.5", req.scaling_rule_id5);
  }
  if(!req.scaling_rule_id6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.6", req.scaling_rule_id6);
  }
  if(!req.scaling_rule_id7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.7", req.scaling_rule_id7);
  }
  if(!req.scaling_rule_id8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.8", req.scaling_rule_id8);
  }
  if(!req.scaling_rule_id9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.9", req.scaling_rule_id9);
  }
  if(!req.scaling_rule_id10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleId.10", req.scaling_rule_id10);
  }
  if(!req.scaling_rule_name1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.1", req.scaling_rule_name1);
  }
  if(!req.scaling_rule_name2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.2", req.scaling_rule_name2);
  }
  if(!req.scaling_rule_name3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.3", req.scaling_rule_name3);
  }
  if(!req.scaling_rule_name4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.4", req.scaling_rule_name4);
  }
  if(!req.scaling_rule_name5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.5", req.scaling_rule_name5);
  }
  if(!req.scaling_rule_name6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.6", req.scaling_rule_name6);
  }
  if(!req.scaling_rule_name7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.7", req.scaling_rule_name7);
  }
  if(!req.scaling_rule_name8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.8", req.scaling_rule_name8);
  }
  if(!req.scaling_rule_name9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.9", req.scaling_rule_name9);
  }
  if(!req.scaling_rule_name10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleName.10", req.scaling_rule_name10);
  }
  if(!req.scaling_rule_ari1.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.1", req.scaling_rule_ari1);
  }
  if(!req.scaling_rule_ari2.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.2", req.scaling_rule_ari2);
  }
  if(!req.scaling_rule_ari3.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.3", req.scaling_rule_ari3);
  }
  if(!req.scaling_rule_ari4.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.4", req.scaling_rule_ari4);
  }
  if(!req.scaling_rule_ari5.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.5", req.scaling_rule_ari5);
  }
  if(!req.scaling_rule_ari6.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.6", req.scaling_rule_ari6);
  }
  if(!req.scaling_rule_ari7.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.7", req.scaling_rule_ari7);
  }
  if(!req.scaling_rule_ari8.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.8", req.scaling_rule_ari8);
  }
  if(!req.scaling_rule_ari9.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.9", req.scaling_rule_ari9);
  }
  if(!req.scaling_rule_ari10.empty()) {
    req_rpc->AddRequestQuery("ScalingRuleAri.10", req.scaling_rule_ari10);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}